

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::ir_store(irGenerator *this,LeftVal *dest,RightVal *src)

{
  uint32_t uVar1;
  VarId *__p;
  StoreInst *this_00;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  *this_01;
  undefined1 local_d0 [24];
  shared_ptr<mir::inst::StoreInst> storeInst;
  shared_ptr<mir::inst::Value> srcValue;
  shared_ptr<mir::inst::VarId> destVarId;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  VarId local_58;
  Value local_48;
  
  destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  srcValue.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  srcValue.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  storeInst.super___shared_ptr<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  storeInst.super___shared_ptr<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (VarId *)operator_new(0x10);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_80,
                    (_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)dest);
  uVar1 = LeftValueToLabelId(this,(LeftVal *)&local_80);
  (__p->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  __p->id = uVar1;
  std::__shared_ptr<mir::inst::VarId,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::VarId,void>
            ((__shared_ptr<mir::inst::VarId,(__gnu_cxx::_Lock_policy)2> *)local_d0,__p);
  std::__shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_80);
  rightValueToValue((irGenerator *)local_d0,(RightVal *)this);
  std::__shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&srcValue.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
  this_00 = (StoreInst *)operator_new(0x38);
  mir::inst::Value::Value
            (&local_48,
             srcValue.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_58.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_58.id = (destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->id;
  mir::inst::StoreInst::StoreInst(this_00,&local_48,&local_58);
  std::__shared_ptr<mir::inst::StoreInst,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::StoreInst,void>
            ((__shared_ptr<mir::inst::StoreInst,(__gnu_cxx::_Lock_policy)2> *)local_d0,this_00);
  std::__shared_ptr<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&storeInst.super___shared_ptr<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
  this_01 = (vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               ::operator[](&this->_funcNameToInstructions,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::
  variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
  ::variant<std::shared_ptr<mir::inst::StoreInst>&,void,void,std::shared_ptr<mir::inst::Inst>,void>
            ((variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
              *)local_d0,&storeInst);
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  ::
  emplace_back<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>
            (this_01,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)local_d0);
  std::__detail::__variant::
  _Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~_Variant_storage((_Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&storeInst.super___shared_ptr<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&srcValue.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void irGenerator::ir_store(LeftVal dest, RightVal src) {
  shared_ptr<VarId> destVarId;
  shared_ptr<Value> srcValue;
  shared_ptr<mir::inst::StoreInst> storeInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  srcValue = rightValueToValue(src);

  storeInst = shared_ptr<mir::inst::StoreInst>(
      new mir::inst::StoreInst(*srcValue, *destVarId));

  _funcNameToInstructions[_funcStack.back()].push_back(storeInst);
}